

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O2

void __thiscall gui::SliderStyle::SliderStyle(SliderStyle *this,Gui *gui)

{
  Vector2f local_28;
  
  Style::Style(&this->super_Style,gui);
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__SliderStyle_001dcef8;
  local_28.x = 0.0;
  local_28.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->rect_,&local_28);
  local_28.x = 0.0;
  local_28.y = 0.0;
  sf::RectangleShape::RectangleShape(&this->thumb_,&local_28);
  sf::Color::Color(&this->colorRect_);
  sf::Color::Color(&this->colorRectHover_);
  sf::Color::Color(&this->colorThumb_);
  sf::Color::Color(&this->colorThumbDown_);
  return;
}

Assistant:

SliderStyle::SliderStyle(const Gui& gui) :
    Style(gui) {
}